

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUnit.h
# Opt level: O3

void __thiscall
QUnit::UnitTest::evaluate
          (UnitTest *this,bool compare,bool result,string *val1,string *val2,string *str1,
          string *str2,char *file,int line,char *func)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  sVar5 = val1->_M_string_length;
  if ((int)CONCAT71(in_register_00000011,result) == 0) {
    bVar9 = true;
    if (sVar5 != val2->_M_string_length) goto LAB_00109c4d;
    if (sVar5 != 0) {
      iVar4 = bcmp((val1->_M_dataplus)._M_p,(val2->_M_dataplus)._M_p,sVar5);
      bVar9 = iVar4 != 0;
      goto LAB_00109c4d;
    }
  }
  else if (sVar5 == val2->_M_string_length) {
    if (sVar5 == 0) {
      bVar9 = true;
    }
    else {
      iVar4 = bcmp((val1->_M_dataplus)._M_p,(val2->_M_dataplus)._M_p,sVar5);
      bVar9 = iVar4 == 0;
    }
    goto LAB_00109c4d;
  }
  bVar9 = false;
LAB_00109c4d:
  uVar1 = this->errors_;
  uVar2 = this->tests_;
  this->errors_ = (uint)(bVar9 ^ 1U) + uVar1;
  this->tests_ = uVar2 + 1;
  if (this->verboseLevel_ != 0 && (this->verboseLevel_ < 3 & bVar9) == 0) {
    poVar6 = this->out_;
    local_38 = val2;
    if (file == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar5 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,file,sVar5);
    }
    pcVar7 = ":";
    if (bVar9 != false) {
      pcVar7 = ";";
    }
    pcVar8 = "FAILED/";
    if (bVar9 != false) {
      pcVar8 = "OK/";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    poVar6 = this->out_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,(ulong)(bVar9 ^ 1U) * 4 + 3);
    if (func == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar5 = strlen(func);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,func,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): ",4);
    if (compare) {
      pcVar7 = "!=";
      if (result) {
        pcVar7 = "==";
      }
      pcVar8 = "!=";
      if (result) {
        pcVar8 = "==";
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar7,pcVar8 + 2);
      poVar6 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"compare {",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(str1->_M_dataplus)._M_p,str1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(str2->_M_dataplus)._M_p,str2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"got {\"",6);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(val1->_M_dataplus)._M_p,val1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"} ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\"",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"}",2);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
    }
    else {
      poVar6 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"evaluate {",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(str1->_M_dataplus)._M_p,str1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} == ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(val1->_M_dataplus)._M_p,val1->_M_string_length);
    }
    cVar3 = (char)this->out_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->out_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

inline void UnitTest::evaluate(
        bool compare, bool result,
        std::string val1, std::string val2,
        std::string str1, std::string str2,
        const char * file, int line, const char * func) {

        bool ok = result ? (val1 == val2) : (val1 != val2);
        tests_ += 1;
        errors_ += ok ? 0 : 1;

        if( (ok && !(verboseLevel_ > normal)) || verboseLevel_ == silent )
            return;

        out_ << file << ( ok ? ";" : ":" ) << line << ": ";
        out_ << ( ok ? "OK/" : "FAILED/" ) << func << "(): ";
        if( compare ) {
            const std::string cmp = ( result ? "==" : "!=" );
            out_ << "compare {" << str1 << "} " << cmp << " {" <<  str2 << "} "
                 << "got {\"" << val1 << "\"} " << cmp << " {\"" << val2 << "\"}";
        } else {
            out_ << "evaluate {" << str1 << "} == " << val1;
        }
        out_ << std::endl;
    }